

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::SharedDtor
          (DictionaryValue_KeyValuePair *this)

{
  Value *pVVar1;
  Arena *pAVar2;
  LogMessage *other;
  DictionaryValue_KeyValuePair *pDVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  DictionaryValue_KeyValuePair *local_10;
  DictionaryValue_KeyValuePair *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x2139);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pDVar3 = internal_default_instance();
  if ((this != pDVar3) && (pVVar1 = this->key_, pVVar1 != (Value *)0x0)) {
    Value::~Value(pVVar1);
    operator_delete(pVVar1,0x30);
  }
  pDVar3 = internal_default_instance();
  if ((this != pDVar3) && (pVVar1 = this->value_, pVVar1 != (Value *)0x0)) {
    Value::~Value(pVVar1);
    operator_delete(pVVar1,0x30);
  }
  return;
}

Assistant:

inline void DictionaryValue_KeyValuePair::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete key_;
  if (this != internal_default_instance()) delete value_;
}